

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.cpp
# Opt level: O3

void baryonyx::context_set_parameters(context_ptr *ctx,string *name,string *value)

{
  context *ctx_00;
  int iVar1;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (name,"method");
  ctx_00 = (ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
           super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
           super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl;
  if (iVar1 != 0) {
    warning<std::__cxx11::string>(ctx_00,"context: unknown variable {}.\n",name);
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&ctx_00->method,value);
  return;
}

Assistant:

void
context_set_parameters(const context_ptr& ctx,
                       const std::string& name,
                       std::string value)
{
    if (name == "method")
        ctx->method = std::move(value);
    else
        warning(*ctx, "context: unknown variable {}.\n", name);
}